

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collation_binding.cpp
# Opt level: O1

void __thiscall duckdb::CollationBinding::CollationBinding(CollationBinding *this)

{
  (this->collations).
  super_vector<duckdb::CollationCallback,_std::allocator<duckdb::CollationCallback>_>.
  super__Vector_base<duckdb::CollationCallback,_std::allocator<duckdb::CollationCallback>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->collations).
  super_vector<duckdb::CollationCallback,_std::allocator<duckdb::CollationCallback>_>.
  super__Vector_base<duckdb::CollationCallback,_std::allocator<duckdb::CollationCallback>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->collations).
  super_vector<duckdb::CollationCallback,_std::allocator<duckdb::CollationCallback>_>.
  super__Vector_base<duckdb::CollationCallback,_std::allocator<duckdb::CollationCallback>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RegisterCollation(this,(CollationCallback)0x74028d);
  RegisterCollation(this,(CollationCallback)0x740a57);
  RegisterCollation(this,(CollationCallback)0x740df9);
  return;
}

Assistant:

CollationBinding::CollationBinding() {
	RegisterCollation(CollationCallback(PushVarcharCollation));
	RegisterCollation(CollationCallback(PushTimeTZCollation));
	RegisterCollation(CollationCallback(PushIntervalCollation));
}